

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O2

laszip_I32 laszip_check_for_integer_overflow(laszip_POINTER pointer)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined4 in_EAX;
  uint uVar8;
  char *__format;
  ulong uVar9;
  undefined4 uVar10;
  uint uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  uint uVar21;
  double dVar22;
  
  if (pointer == (laszip_POINTER)0x0) {
    return 1;
  }
  dVar17 = *(double *)((long)pointer + 0xb8);
  dVar1 = *(double *)((long)pointer + 0x98);
  dVar14 = *(double *)((long)pointer + 0x80);
  dVar12 = (dVar17 - dVar1) / dVar14;
  uVar9 = -(ulong)(dVar12 < 0.0);
  dVar3 = *(double *)((long)pointer + 0xa0);
  dVar4 = *(double *)((long)pointer + 0xa8);
  auVar2 = *(undefined1 (*) [16])((long)pointer + 0x88);
  dVar13 = auVar2._0_8_;
  dVar15 = auVar2._8_8_;
  dVar5 = *(double *)((long)pointer + 0xd0);
  dVar6 = *(double *)((long)pointer + 0xd8);
  dVar7 = *(double *)((long)pointer + 0xc0);
  dVar16 = *(double *)((long)pointer + 200);
  auVar19._0_8_ = dVar16 - dVar3;
  auVar19._8_8_ = dVar6 - dVar4;
  auVar18._0_8_ = dVar7 - dVar3;
  auVar18._8_8_ = dVar5 - dVar4;
  auVar18 = divpd(auVar18,auVar2);
  auVar19 = divpd(auVar19,auVar2);
  auVar2._4_4_ = -(uint)(auVar18._8_8_ < 0.0);
  auVar2._0_4_ = -(uint)(auVar18._0_8_ < 0.0);
  auVar2._8_4_ = -(uint)(auVar19._0_8_ < 0.0);
  auVar2._12_4_ = -(uint)(auVar19._8_8_ < 0.0);
  uVar8 = movmskps(in_EAX,auVar2);
  dVar22 = -0.5;
  if ((uVar8 & 4) == 0) {
    dVar22 = 0.5;
  }
  uVar11 = 0xbfe00000;
  if ((uVar8 & 1) == 0) {
    uVar11 = 0x3fe00000;
  }
  uVar20 = 0xbfe00000;
  if ((uVar8 & 8) == 0) {
    uVar20 = 0x3fe00000;
  }
  uVar21 = 0xbfe00000;
  if ((uVar8 & 2) == 0) {
    uVar21 = 0x3fe00000;
  }
  dVar12 = (double)(int)(dVar12 + (double)(~uVar9 & 0x3fe0000000000000 |
                                          (ulong)((uint)(uVar9 >> 0x20) & 0xbfe00000) << 0x20)) *
           dVar14 + dVar1;
  if (dVar12 <= 0.0 == 0.0 < dVar17) {
    __format = 
    "quantization sign flip for min_x from %g to %g. set scale factor for x coarser than %g\n";
  }
  else {
    dVar17 = *(double *)((long)pointer + 0xb0);
    dVar12 = (dVar17 - dVar1) / dVar14;
    uVar9 = -(ulong)(dVar12 < 0.0);
    dVar12 = (double)(int)((double)(~uVar9 & 0x3fe0000000000000 | uVar9 & 0xbfe0000000000000) +
                          dVar12) * dVar14 + dVar1;
    if (dVar12 <= 0.0 != 0.0 < dVar17) {
      dVar12 = (double)(int)(dVar22 + auVar19._0_8_) * dVar13 + dVar3;
      if (dVar12 <= 0.0 == 0.0 < dVar16) {
        __format = 
        "quantization sign flip for min_y from %g to %g. set scale factor for y coarser than %g\n";
      }
      else {
        dVar12 = (double)(int)((double)((ulong)uVar11 << 0x20) + auVar18._0_8_) * dVar13 + dVar3;
        if (0.0 < dVar7 == dVar12 <= 0.0) {
          __format = 
          "quantization sign flip for max_y from %g to %g. set scale factor for y coarser than %g\n"
          ;
          uVar10 = SUB84(dVar7,0);
          dVar14 = dVar13;
          goto LAB_00141dff;
        }
        dVar12 = (double)(int)(auVar19._8_8_ + (double)((ulong)uVar20 << 0x20)) * dVar15 + dVar4;
        uVar10 = SUB84(dVar5,0);
        if (0.0 < dVar6 != dVar12 <= 0.0) {
          dVar12 = dVar15 * (double)(int)(auVar18._8_8_ + (double)((ulong)uVar21 << 0x20)) + dVar4;
          if (0.0 < dVar5 != dVar12 <= 0.0) {
            *(undefined1 *)((long)pointer + 0x248) = 0;
            return 0;
          }
          __format = 
          "quantization sign flip for max_z from %g to %g. set scale factor for z coarser than %g\n"
          ;
          dVar14 = dVar15;
          goto LAB_00141dff;
        }
        __format = 
        "quantization sign flip for min_z from %g to %g. set scale factor for z coarser than %g\n";
        dVar13 = dVar15;
        dVar16 = dVar6;
      }
      uVar10 = SUB84(dVar16,0);
      dVar14 = dVar13;
      goto LAB_00141dff;
    }
    __format = 
    "quantization sign flip for max_x from %g to %g. set scale factor for x coarser than %g\n";
  }
  uVar10 = SUB84(dVar17,0);
LAB_00141dff:
  snprintf((char *)((long)pointer + 0x248),0x400,__format,uVar10,dVar12,dVar14);
  return 1;
}

Assistant:

LASZIP_API laszip_I32
laszip_check_for_integer_overflow(
    laszip_POINTER                     pointer
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    // get a pointer to the header

    laszip_header_struct* header = &(laszip_dll->header);

    // quantize and dequantize the bounding box with current scale_factor and offset

    I32 quant_min_x = I32_QUANTIZE((header->min_x-header->x_offset)/header->x_scale_factor);
    I32 quant_max_x = I32_QUANTIZE((header->max_x-header->x_offset)/header->x_scale_factor);
    I32 quant_min_y = I32_QUANTIZE((header->min_y-header->y_offset)/header->y_scale_factor);
    I32 quant_max_y = I32_QUANTIZE((header->max_y-header->y_offset)/header->y_scale_factor);
    I32 quant_min_z = I32_QUANTIZE((header->min_z-header->z_offset)/header->z_scale_factor);
    I32 quant_max_z = I32_QUANTIZE((header->max_z-header->z_offset)/header->z_scale_factor);

    F64 dequant_min_x = header->x_scale_factor*quant_min_x+header->x_offset;
    F64 dequant_max_x = header->x_scale_factor*quant_max_x+header->x_offset;
    F64 dequant_min_y = header->y_scale_factor*quant_min_y+header->y_offset;
    F64 dequant_max_y = header->y_scale_factor*quant_max_y+header->y_offset;
    F64 dequant_min_z = header->z_scale_factor*quant_min_z+header->z_offset;
    F64 dequant_max_z = header->z_scale_factor*quant_max_z+header->z_offset;

    // make sure that there is not sign flip (a 32-bit integer overflow) for the bounding box

    if ((header->min_x > 0) != (dequant_min_x > 0))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "quantization sign flip for min_x from %g to %g. set scale factor for x coarser than %g\n", header->min_x, dequant_min_x, header->x_scale_factor);
      return 1;
    }
    if ((header->max_x > 0) != (dequant_max_x > 0))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "quantization sign flip for max_x from %g to %g. set scale factor for x coarser than %g\n", header->max_x, dequant_max_x, header->x_scale_factor);
      return 1;
    }
    if ((header->min_y > 0) != (dequant_min_y > 0))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "quantization sign flip for min_y from %g to %g. set scale factor for y coarser than %g\n", header->min_y, dequant_min_y, header->y_scale_factor);
      return 1;
    }
    if ((header->max_y > 0) != (dequant_max_y > 0))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "quantization sign flip for max_y from %g to %g. set scale factor for y coarser than %g\n", header->max_y, dequant_max_y, header->y_scale_factor);
      return 1;
    }
    if ((header->min_z > 0) != (dequant_min_z > 0))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "quantization sign flip for min_z from %g to %g. set scale factor for z coarser than %g\n", header->min_z, dequant_min_z, header->z_scale_factor);
      return 1;
    }
    if ((header->max_z > 0) != (dequant_max_z > 0))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "quantization sign flip for max_z from %g to %g. set scale factor for z coarser than %g\n", header->max_z, dequant_max_z, header->z_scale_factor);
      return 1;
    }
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_auto_offset");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}